

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> __thiscall
capnp::compiler::NodeTranslator::BrandScope::setParams
          (BrandScope *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Which genericType,Reader source)

{
  ulong uVar1;
  short in_CX;
  undefined6 in_register_00000012;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *params_1;
  char *pcVar2;
  BrandScope *pBVar3;
  ulong uVar4;
  BrandScope *extraout_RDX_00;
  ArrayDisposer *this_00;
  Reader *decl;
  long lVar5;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *__range6;
  Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> MVar6;
  StringPtr message;
  StringPtr message_00;
  size_t sStack_50;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_48;
  BrandScope *extraout_RDX;
  
  params_1 = (Array<capnp::compiler::NodeTranslator::BrandedDecl> *)
             CONCAT62(in_register_00000012,genericType);
  if (params[2].disposer == (ArrayDisposer *)0x0) {
    uVar1 = params_1->size_;
    uVar4 = (ulong)*(uint *)&params[2].ptr;
    if (uVar4 < uVar1) {
      this_00 = params->disposer;
      if (uVar4 == 0) {
        pcVar2 = "Declaration does not accept generic parameters.";
        sStack_50 = 0x30;
      }
      else {
        pcVar2 = "Too many generic parameters.";
        sStack_50 = 0x1d;
      }
    }
    else {
      if (uVar4 <= uVar1) {
        if (in_CX != 0x1c) {
          decl = &params_1->ptr->source;
          for (lVar5 = uVar1 * 0xa8; lVar5 != 0; lVar5 = lVar5 + -0xa8) {
            if ((*(int *)((long)(decl + -3) + 0x18) != 2) &&
               ((0x1e < *(ushort *)((long)(decl + -2) + 8) ||
                ((0x5c000220U >> (*(ushort *)((long)(decl + -2) + 8) & 0x1f) & 1) == 0)))) {
              message_00.content.size_ = 0x3d;
              message_00.content.ptr =
                   "Sorry, only pointer types can be used as generic parameters.";
              ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                        ((ErrorReporter *)params->disposer,decl,message_00);
            }
            decl = (Reader *)((long)(decl + 3) + 0x18);
          }
        }
        kj::
        refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::NodeTranslator::BrandScope&,kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>>
                  ((kj *)&local_48,(BrandScope *)params,params_1);
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_48.disposer;
        *(BrandScope **)&(this->super_Refcounted).refcount = local_48.ptr;
        local_48.ptr = (BrandScope *)0x0;
        kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose(&local_48);
        pBVar3 = extraout_RDX_00;
        goto LAB_0021d411;
      }
      this_00 = params->disposer;
      pcVar2 = "Not enough generic parameters.";
      sStack_50 = 0x1f;
    }
  }
  else {
    this_00 = params->disposer;
    pcVar2 = "Double-application of generic parameters.";
    sStack_50 = 0x2a;
  }
  message.content.size_ = sStack_50;
  message.content.ptr = pcVar2;
  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
            ((ErrorReporter *)this_00,&source,message);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  pBVar3 = extraout_RDX;
LAB_0021d411:
  MVar6.ptr.ptr = pBVar3;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>)MVar6.ptr;
}

Assistant:

kj::Maybe<kj::Own<BrandScope>> setParams(
      kj::Array<BrandedDecl> params, Declaration::Which genericType, Expression::Reader source) {
    if (this->params.size() != 0) {
      errorReporter.addErrorOn(source, "Double-application of generic parameters.");
      return nullptr;
    } else if (params.size() > leafParamCount) {
      if (leafParamCount == 0) {
        errorReporter.addErrorOn(source, "Declaration does not accept generic parameters.");
      } else {
        errorReporter.addErrorOn(source, "Too many generic parameters.");
      }
      return nullptr;
    } else if (params.size() < leafParamCount) {
      errorReporter.addErrorOn(source, "Not enough generic parameters.");
      return nullptr;
    } else {
      if (genericType != Declaration::BUILTIN_LIST) {
        for (auto& param: params) {
          KJ_IF_MAYBE(kind, param.getKind()) {
            switch (*kind) {
              case Declaration::BUILTIN_LIST:
              case Declaration::BUILTIN_TEXT:
              case Declaration::BUILTIN_DATA:
              case Declaration::BUILTIN_ANY_POINTER:
              case Declaration::STRUCT:
              case Declaration::INTERFACE:
                break;

              default:
                param.addError(errorReporter,
                    "Sorry, only pointer types can be used as generic parameters.");
                break;
            }
          }
        }
      }

      return kj::refcounted<BrandScope>(*this, kj::mv(params));
    }
  }